

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

void just::environment::set(string *name_,string *value_)

{
  int iVar1;
  char *__name;
  char *__value;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *value__local;
  string *name__local;
  
  local_18 = value_;
  value__local = name_;
  __name = (char *)std::__cxx11::string::c_str();
  __value = (char *)std::__cxx11::string::c_str();
  iVar1 = setenv(__name,__value,1);
  if (iVar1 != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_78,"Error setting ",value__local);
    std::operator+(&local_58,&local_78,"=");
    std::operator+(&local_38,&local_58,local_18);
    std::runtime_error::runtime_error(this,(string *)&local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

inline void set(const std::string& name_, const std::string& value_)
    {
      if (setenv(name_.c_str(), value_.c_str(), 1))
      {
        throw std::runtime_error("Error setting " + name_ + "=" + value_);
      }
    }